

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void RunBench(Benchmark *b,int nthread,int siz)

{
  int iVar1;
  int n_00;
  int *piVar2;
  double __x;
  char local_108 [8];
  char suf [100];
  char local_98 [8];
  char mb [100];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int last;
  int n;
  int siz_local;
  int nthread_local;
  Benchmark *b_local;
  
  if (nthread == 1) {
    local_1c = 1;
    last = siz;
    n = nthread;
    _siz_local = b;
    runN(b,1,siz);
    while (iVar1 = local_1c, ns < 1000000000 && local_1c < 1000000000) {
      local_20 = local_1c;
      if (ns / (long)local_1c == 0) {
        local_1c = 1000000000;
      }
      else {
        local_1c = (int)(1000000000 / (long)(int)(ns / (long)local_1c));
      }
      local_24 = iVar1 + 1;
      local_28 = local_1c + local_1c / 2;
      local_2c = iVar1 * 100;
      piVar2 = std::min<int>(&local_28,&local_2c);
      piVar2 = std::max<int>(&local_24,piVar2);
      local_1c = *piVar2;
      round(__x);
      local_1c = n_00;
      runN(_siz_local,n_00,last);
    }
    local_98[0] = '\0';
    local_108[0] = '\0';
    if ((0 < ns) && (0 < bytes)) {
      snprintf(local_98,100,"\t%7.2f MB/s",((double)bytes / 1000000.0) / ((double)ns / 1000000000.0)
              );
    }
    if ((_siz_local->fnr != (_func_void_int_int *)0x0) || (_siz_local->lo != _siz_local->hi)) {
      if (last < 0x100000) {
        if (last < 0x400) {
          snprintf(local_108,100,"/%d",(ulong)(uint)last);
        }
        else {
          snprintf(local_108,100,"/%dK",(long)last / 0x400 & 0xffffffff);
        }
      }
      else {
        snprintf(local_108,100,"/%dM",(long)last / 0x100000 & 0xffffffff);
      }
    }
    printf("%s%s\t%8lld\t%10lld ns/op%s\n",_siz_local->name,local_108,(long)local_1c,
           ns / (long)local_1c,local_98);
    fflush(_stdout);
  }
  return;
}

Assistant:

void RunBench(Benchmark* b, int nthread, int siz) {
	int n, last;

	// TODO(rsc): Threaded benchmarks.
	if(nthread != 1)
		return;
	
	// run once in case it's expensive
	n = 1;
	runN(b, n, siz);
	while(ns < (int)1e9 && n < (int)1e9) {
		last = n;
		if(ns/n == 0)
			n = (int)1e9;
		else
			n = (int)1e9 / static_cast<int>(ns/n);
		
		n = max(last+1, min(n+n/2, 100*last));
		n = round(n);
		runN(b, n, siz);
	}
	
	char mb[100];
	char suf[100];
	mb[0] = '\0';
	suf[0] = '\0';
	if(ns > 0 && bytes > 0)
		snprintf(mb, sizeof mb, "\t%7.2f MB/s", ((double)bytes/1e6)/((double)ns/1e9));
	if(b->fnr || b->lo != b->hi) {
		if(siz >= (1<<20))
			snprintf(suf, sizeof suf, "/%dM", siz/(1<<20));
		else if(siz >= (1<<10))
			snprintf(suf, sizeof suf, "/%dK", siz/(1<<10));
		else
			snprintf(suf, sizeof suf, "/%d", siz);
	}
	printf("%s%s\t%8lld\t%10lld ns/op%s\n", b->name, suf, (long long)n, (long long)ns/n, mb);
	fflush(stdout);
}